

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O0

void __kmp_api_omp_get_schedule_(kmp_sched_t *kind,int *modifier)

{
  int *in_stack_00000060;
  kmp_sched_t *in_stack_00000068;
  int in_stack_00000074;
  
  __kmp_get_global_thread_id_reg();
  __kmp_get_schedule(in_stack_00000074,in_stack_00000068,in_stack_00000060);
  return;
}

Assistant:

void FTN_STDCALL
xexpand(FTN_GET_SCHEDULE)( kmp_sched_t * kind, int * modifier )
{
    #ifdef KMP_STUB
        __kmps_get_schedule( kind, modifier );
    #else
	/*  TO DO  */
	/* For the per-task implementation of the internal controls */
        __kmp_get_schedule( __kmp_entry_gtid(), kind, modifier );
    #endif
}